

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

void __thiscall docopt::Option::Option(Option *this,Option *param_1)

{
  Variant *this_00;
  Kind KVar1;
  pointer pcVar2;
  pointer pbVar3;
  
  (this->super_LeafPattern).super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_0014efb8;
  (this->super_LeafPattern).fName._M_dataplus._M_p =
       (pointer)&(this->super_LeafPattern).fName.field_2;
  pcVar2 = (param_1->super_LeafPattern).fName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_LeafPattern).fName,pcVar2,
             pcVar2 + (param_1->super_LeafPattern).fName._M_string_length);
  KVar1 = (param_1->super_LeafPattern).fValue.kind_;
  (this->super_LeafPattern).fValue.kind_ = KVar1;
  if (KVar1 - Bool < 4) {
    this_00 = &(this->super_LeafPattern).fValue.variant_;
    switch(KVar1) {
    case Bool:
      this_00->boolValue = (param_1->super_LeafPattern).fValue.variant_.boolValue;
      break;
    case Long:
      this_00->longValue = (param_1->super_LeafPattern).fValue.variant_.longValue;
      break;
    case String:
      (this->super_LeafPattern).fValue.variant_.strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&(this->super_LeafPattern).fValue.variant_ + 0x10);
      pbVar3 = (param_1->super_LeafPattern).fValue.variant_.strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)this_00,pbVar3,
                 (long)&(pbVar3->_M_dataplus)._M_p +
                 (long)&(((param_1->super_LeafPattern).fValue.variant_.strList.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p);
      break;
    case StringList:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&this_00->strList,&(param_1->super_LeafPattern).fValue.variant_.strList);
    }
  }
  (this->super_LeafPattern).super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_0014f0d8;
  (this->fShortOption)._M_dataplus._M_p = (pointer)&(this->fShortOption).field_2;
  pcVar2 = (param_1->fShortOption)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fShortOption,pcVar2,pcVar2 + (param_1->fShortOption)._M_string_length)
  ;
  (this->fLongOption)._M_dataplus._M_p = (pointer)&(this->fLongOption).field_2;
  pcVar2 = (param_1->fLongOption)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fLongOption,pcVar2,pcVar2 + (param_1->fLongOption)._M_string_length);
  this->fArgcount = param_1->fArgcount;
  return;
}

Assistant:

Option(Option const&) = default;